

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtag_fsm.cpp
# Opt level: O2

State Jtag_fsm::getStateFromName(string *s)

{
  bool bVar1;
  ostream *poVar2;
  State SVar3;
  
  bVar1 = std::operator==(s,"RESET");
  SVar3 = TEST_LOGIC_RESET;
  if (!bVar1) {
    bVar1 = std::operator==(s,"IDLE");
    if (bVar1) {
      SVar3 = RUN_TEST_IDLE;
    }
    else {
      bVar1 = std::operator==(s,"DRSELECT");
      if (bVar1) {
        SVar3 = SELECT_DR_SCAN;
      }
      else {
        bVar1 = std::operator==(s,"DRCAPTURE");
        if (bVar1) {
          SVar3 = CAPTURE_DR;
        }
        else {
          bVar1 = std::operator==(s,"DRSHIFT");
          if (bVar1) {
            SVar3 = SHIFT_DR;
          }
          else {
            bVar1 = std::operator==(s,"DREXIT1");
            if (bVar1) {
              SVar3 = EXIT1_DR;
            }
            else {
              bVar1 = std::operator==(s,"DRPAUSE");
              if (bVar1) {
                SVar3 = PAUSE_DR;
              }
              else {
                bVar1 = std::operator==(s,"DREXIT2");
                if (bVar1) {
                  SVar3 = EXIT2_DR;
                }
                else {
                  bVar1 = std::operator==(s,"DRUPDATE");
                  if (bVar1) {
                    SVar3 = UPDATE_DR;
                  }
                  else {
                    bVar1 = std::operator==(s,"IRSELECT");
                    if (bVar1) {
                      SVar3 = SELECT_IR_SCAN;
                    }
                    else {
                      bVar1 = std::operator==(s,"IRCAPTURE");
                      if (bVar1) {
                        SVar3 = CAPTURE_IR;
                      }
                      else {
                        bVar1 = std::operator==(s,"IRSHIFT");
                        if (bVar1) {
                          SVar3 = SHIFT_IR;
                        }
                        else {
                          bVar1 = std::operator==(s,"IREXIT1");
                          if (bVar1) {
                            SVar3 = EXIT1_IR;
                          }
                          else {
                            bVar1 = std::operator==(s,"IRPAUSE");
                            if (bVar1) {
                              SVar3 = PAUSE_IR;
                            }
                            else {
                              bVar1 = std::operator==(s,"IREXIT2");
                              if (bVar1) {
                                SVar3 = EXIT2_IR;
                              }
                              else {
                                bVar1 = std::operator==(s,"IRUPDATE");
                                if (bVar1) {
                                  SVar3 = UPDATE_IR;
                                }
                                else {
                                  poVar2 = std::operator<<((ostream *)&std::cerr,
                                                           "ERROR! Invalid state name ");
                                  poVar2 = std::operator<<(poVar2,(string *)s);
                                  std::endl<char,std::char_traits<char>>(poVar2);
                                  SVar3 = TEST_LOGIC_RESET;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return SVar3;
}

Assistant:

Jtag_fsm::State Jtag_fsm::getStateFromName(string s) {
	if (s == "RESET")
		return TEST_LOGIC_RESET;
	if (s == "IDLE")
		return RUN_TEST_IDLE;
	if (s == "DRSELECT")
		return SELECT_DR_SCAN;
	if (s == "DRCAPTURE")
		return CAPTURE_DR;
	if (s == "DRSHIFT")
		return SHIFT_DR;
	if (s == "DREXIT1")
		return EXIT1_DR;
	if (s == "DRPAUSE")
		return PAUSE_DR;
	if (s == "DREXIT2")
		return EXIT2_DR;
	if (s == "DRUPDATE")
		return UPDATE_DR;
	if (s == "IRSELECT")
		return SELECT_IR_SCAN;
	if (s == "IRCAPTURE")
		return CAPTURE_IR;
	if (s == "IRSHIFT")
		return SHIFT_IR;
	if (s == "IREXIT1")
		return EXIT1_IR;
	if (s == "IRPAUSE")
		return PAUSE_IR;
	if (s == "IREXIT2")
		return EXIT2_IR;
	if (s == "IRUPDATE")
		return UPDATE_IR;

	cerr << "ERROR! Invalid state name " << s << endl;
	return TEST_LOGIC_RESET;
}